

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O3

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertToStereo(SoundData *this)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  ulong uVar5;
  uchar *puVar6;
  
  if (this->stereo == YSTRUE) {
    return YSOK;
  }
  if (this->bit == 0x10) {
    uVar3 = this->sizeInBytes;
    puVar6 = (uchar *)operator_new__((ulong)(uVar3 * 2));
    if ((ulong)uVar3 != 0) {
      puVar4 = this->dat;
      uVar5 = 0;
      do {
        uVar1 = puVar4[uVar5];
        puVar6[uVar5 * 2] = uVar1;
        uVar2 = puVar4[uVar5 + 1];
        puVar6[uVar5 * 2 + 1] = uVar2;
        puVar6[uVar5 * 2 + 2] = uVar1;
        puVar6[uVar5 * 2 + 3] = uVar2;
        uVar5 = uVar5 + 2;
      } while (uVar5 < uVar3);
    }
    this->dat = puVar6;
    this->stereo = YSTRUE;
    this->sizeInBytes = uVar3 * 2;
    return YSOK;
  }
  if (this->bit != 8) {
    return YSERR;
  }
  uVar3 = this->sizeInBytes;
  puVar4 = (uchar *)operator_new__((ulong)(uVar3 * 2));
  puVar6 = this->dat;
  if ((ulong)uVar3 == 0) {
    if (puVar6 == (uchar *)0x0) {
      uVar3 = 0;
      goto LAB_00111dbf;
    }
  }
  else {
    uVar5 = 0;
    do {
      uVar1 = puVar6[uVar5];
      puVar4[uVar5 * 2] = uVar1;
      puVar4[uVar5 * 2 + 1] = uVar1;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  operator_delete__(puVar6);
  uVar3 = this->sizeInBytes * 2;
LAB_00111dbf:
  this->dat = puVar4;
  this->stereo = YSTRUE;
  this->sizeInBytes = uVar3;
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertToStereo(void)
{
	if(stereo==YSTRUE)
	{
		return YSOK;
	}
	else
	{
		if(bit==8)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i++)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i];
			}
			delete [] dat;
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
		else if(bit==16)
		{
			unsigned char *newDat=new unsigned char [sizeInBytes*2];
			for(int i=0; i<sizeInBytes; i+=2)
			{
				newDat[i*2  ]=dat[i];
				newDat[i*2+1]=dat[i+1];
				newDat[i*2+2]=dat[i];
				newDat[i*2+3]=dat[i+1];
			}
			dat=newDat;
			stereo=YSTRUE;
			sizeInBytes*=2;
			return YSOK;
		}
	}
	return YSERR;
}